

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O0

void h265e_nal_encode(RK_U8 *dst,H265eNal *nal)

{
  int iVar1;
  RK_U8 *pRVar2;
  RK_U8 *pRVar3;
  undefined1 local_68 [8];
  MppWriteCtx s;
  RK_U8 *orig_dst;
  RK_U8 *end;
  RK_U8 *src;
  RK_S32 size;
  RK_S32 b_annexb;
  H265eNal *nal_local;
  RK_U8 *dst_local;
  
  pRVar3 = nal->p_payload;
  pRVar2 = nal->p_payload;
  iVar1 = nal->i_payload;
  *dst = '\0';
  dst[1] = '\0';
  dst[2] = '\0';
  dst[3] = '\x01';
  nal_local = (H265eNal *)(dst + 4);
  s._40_8_ = dst;
  mpp_writer_init((MppWriteCtx *)local_68,nal_local,10);
  mpp_writer_put_bits((MppWriteCtx *)local_68,0,1);
  mpp_writer_put_bits((MppWriteCtx *)local_68,nal->i_type,6);
  mpp_writer_put_bits((MppWriteCtx *)local_68,0,6);
  mpp_writer_put_bits((MppWriteCtx *)local_68,nal->temporal_id + 1,3);
  pRVar3 = h265e_nal_escape_c(dst + 6,pRVar3,pRVar2 + iVar1);
  nal->i_payload = (int)pRVar3 - s.emul_cnt;
  nal->p_payload = (RK_U8 *)s._40_8_;
  return;
}

Assistant:

static void h265e_nal_encode(RK_U8 *dst, H265eNal *nal)
{
    RK_S32 b_annexb = 1;
    RK_S32 size = 0;
    RK_U8 *src = nal->p_payload;
    RK_U8 *end = nal->p_payload + nal->i_payload;
    RK_U8 *orig_dst = dst;
    MppWriteCtx s;

    if (b_annexb) {
        *dst++ = 0x00;
        *dst++ = 0x00;
        *dst++ = 0x00;
        *dst++ = 0x01;
    } else /* save room for size later */
        dst += 4;

    /* nal header */
    mpp_writer_init(&s, dst, 10);
    mpp_writer_put_bits(&s, 0, 1); //forbidden_zero_bit
    mpp_writer_put_bits(&s, nal->i_type, 6);//nal_unit_type
    mpp_writer_put_bits(&s, 0, 6); //nuh_reserved_zero_6bits
    mpp_writer_put_bits(&s, nal->temporal_id + 1, 3); //nuh_temporal_id_plus1
    dst += 2;
    dst = h265e_nal_escape_c(dst, src, end);
    size = (RK_S32)((dst - orig_dst) - 4);

    /* Write the size header for mp4/etc */
    if (!b_annexb) {
        /* Size doesn't include the size of the header we're writing now. */
        orig_dst[0] = size >> 24;
        orig_dst[1] = size >> 16;
        orig_dst[2] = size >> 8;
        orig_dst[3] = size >> 0;
    }

    nal->i_payload = size + 4;
    nal->p_payload = orig_dst;
}